

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# red_black_tree.cpp
# Opt level: O3

void eastl::RBTreeInsert(rbtree_node_base *pNode,rbtree_node_base *pNodeParent,
                        rbtree_node_base *pNodeAnchor,RBTreeSide insertionSide)

{
  rbtree_node_base *prVar1;
  this_type *ptVar2;
  this_type *ptVar3;
  this_type *ptVar4;
  rbtree_node_base *pNodeTemp;
  this_type *ptVar5;
  this_type *ptVar6;
  rbtree_node_base *pNodeTemp_1;
  this_type *ptVar7;
  
  pNode->mpNodeParent = pNodeParent;
  pNode->mColor = '\0';
  pNode->mpNodeRight = (this_type *)0x0;
  pNode->mpNodeLeft = (this_type *)0x0;
  prVar1 = pNodeAnchor;
  if (insertionSide == kRBTreeSideLeft) {
    pNodeParent->mpNodeLeft = pNode;
    if (pNodeParent == pNodeAnchor) {
      pNodeAnchor->mpNodeParent = pNode;
    }
    else {
      if (pNodeAnchor->mpNodeLeft != pNodeParent) goto LAB_00104f3f;
      prVar1 = (rbtree_node_base *)&pNodeAnchor->mpNodeLeft;
    }
  }
  else {
    pNodeParent->mpNodeRight = pNode;
    if (pNodeAnchor->mpNodeRight != pNodeParent) goto LAB_00104f3f;
  }
  prVar1->mpNodeRight = pNode;
LAB_00104f3f:
  ptVar2 = pNodeAnchor->mpNodeParent;
  if (ptVar2 != pNode) {
    do {
      ptVar5 = pNode->mpNodeParent;
      if (ptVar5->mColor != '\0') break;
      ptVar3 = ptVar5->mpNodeParent;
      ptVar6 = ptVar3->mpNodeLeft;
      if (ptVar5 == ptVar6) {
        ptVar7 = ptVar3->mpNodeRight;
        if ((ptVar7 == (this_type *)0x0) || (ptVar7->mColor != '\0')) {
          ptVar7 = ptVar5->mpNodeRight;
          if (pNode == ptVar7) {
            ptVar6 = ptVar7->mpNodeLeft;
            ptVar5->mpNodeRight = ptVar6;
            ptVar4 = ptVar3;
            if (ptVar6 != (this_type *)0x0) {
              ptVar6->mpNodeParent = ptVar5;
              ptVar4 = ptVar5->mpNodeParent;
            }
            ptVar7->mpNodeParent = ptVar4;
            ptVar6 = ptVar7;
            if (ptVar5 != ptVar2) {
              ptVar6 = (this_type *)&ptVar4->mpNodeLeft;
              if (ptVar4->mpNodeLeft != ptVar5) {
                ptVar6 = ptVar4;
              }
              ptVar6->mpNodeRight = ptVar7;
              ptVar6 = ptVar2;
            }
            ptVar2 = ptVar6;
            ptVar7->mpNodeLeft = ptVar5;
            ptVar5->mpNodeParent = ptVar7;
            pNodeAnchor->mpNodeParent = ptVar2;
            ptVar6 = ptVar3->mpNodeLeft;
            pNode = ptVar5;
            ptVar5 = ptVar5->mpNodeParent;
          }
          ptVar5->mColor = '\x01';
          ptVar3->mColor = '\0';
          ptVar5 = ptVar6->mpNodeRight;
          ptVar3->mpNodeLeft = ptVar5;
          if (ptVar5 != (this_type *)0x0) {
            ptVar5->mpNodeParent = ptVar3;
          }
          ptVar5 = ptVar3->mpNodeParent;
          ptVar6->mpNodeParent = ptVar5;
          ptVar7 = ptVar6;
          if (ptVar3 != ptVar2) {
            (&ptVar5->mpNodeRight)[ptVar5->mpNodeRight != ptVar3] = ptVar6;
            ptVar7 = ptVar2;
          }
          ptVar6->mpNodeRight = ptVar3;
          ptVar3->mpNodeParent = ptVar6;
          ptVar2 = ptVar7;
          goto LAB_001050e0;
        }
        ptVar5->mColor = '\x01';
        ptVar7->mColor = '\x01';
LAB_001050f0:
        ptVar3->mColor = '\0';
      }
      else {
        if ((ptVar6 != (this_type *)0x0) && (ptVar6->mColor == '\0')) {
          ptVar5->mColor = '\x01';
          ptVar6->mColor = '\x01';
          goto LAB_001050f0;
        }
        ptVar6 = ptVar5->mpNodeLeft;
        if (pNode == ptVar6) {
          ptVar7 = ptVar6->mpNodeRight;
          ptVar5->mpNodeLeft = ptVar7;
          ptVar4 = ptVar3;
          if (ptVar7 != (this_type *)0x0) {
            ptVar7->mpNodeParent = ptVar5;
            ptVar4 = ptVar5->mpNodeParent;
          }
          ptVar6->mpNodeParent = ptVar4;
          ptVar7 = ptVar6;
          if (ptVar5 != ptVar2) {
            (&ptVar4->mpNodeRight)[ptVar4->mpNodeRight != ptVar5] = ptVar6;
            ptVar7 = ptVar2;
          }
          ptVar2 = ptVar7;
          ptVar6->mpNodeRight = ptVar5;
          ptVar5->mpNodeParent = ptVar6;
          pNodeAnchor->mpNodeParent = ptVar2;
          pNode = ptVar5;
          ptVar5 = ptVar5->mpNodeParent;
        }
        ptVar5->mColor = '\x01';
        ptVar3->mColor = '\0';
        ptVar5 = ptVar3->mpNodeRight;
        ptVar6 = ptVar5->mpNodeLeft;
        ptVar3->mpNodeRight = ptVar6;
        if (ptVar6 != (this_type *)0x0) {
          ptVar6->mpNodeParent = ptVar3;
        }
        ptVar6 = ptVar3->mpNodeParent;
        ptVar5->mpNodeParent = ptVar6;
        ptVar7 = ptVar5;
        if (ptVar3 != ptVar2) {
          (&ptVar6->mpNodeRight)[ptVar6->mpNodeLeft == ptVar3] = ptVar5;
          ptVar7 = ptVar2;
        }
        ptVar5->mpNodeLeft = ptVar3;
        ptVar3->mpNodeParent = ptVar5;
        ptVar2 = ptVar7;
LAB_001050e0:
        pNodeAnchor->mpNodeParent = ptVar2;
        ptVar3 = pNode;
      }
      pNode = ptVar3;
    } while (ptVar3 != ptVar2);
  }
  ptVar2->mColor = '\x01';
  return;
}

Assistant:

EASTL_API void RBTreeInsert(rbtree_node_base* pNode,
                                rbtree_node_base* pNodeParent, 
                                rbtree_node_base* pNodeAnchor,
                                RBTreeSide insertionSide)
    {
        rbtree_node_base*& pNodeRootRef = pNodeAnchor->mpNodeParent;

        // Initialize fields in new node to insert.
        pNode->mpNodeParent = pNodeParent;
        pNode->mpNodeRight  = NULL;
        pNode->mpNodeLeft   = NULL;
        pNode->mColor       = kRBTreeColorRed;

        // Insert the node.
        if(insertionSide == kRBTreeSideLeft)
        {
            pNodeParent->mpNodeLeft = pNode; // Also makes (leftmost = pNode) when (pNodeParent == pNodeAnchor)

            if(pNodeParent == pNodeAnchor)
            {
                pNodeAnchor->mpNodeParent = pNode;
                pNodeAnchor->mpNodeRight = pNode;
            }
            else if(pNodeParent == pNodeAnchor->mpNodeLeft)
                pNodeAnchor->mpNodeLeft = pNode; // Maintain leftmost pointing to min node
        }
        else
        {
            pNodeParent->mpNodeRight = pNode;

            if(pNodeParent == pNodeAnchor->mpNodeRight)
                pNodeAnchor->mpNodeRight = pNode; // Maintain rightmost pointing to max node
        }

        // Rebalance the tree.
        while((pNode != pNodeRootRef) && (pNode->mpNodeParent->mColor == kRBTreeColorRed)) 
        {
            rbtree_node_base* const pNodeParentParent = pNode->mpNodeParent->mpNodeParent;

            if(pNode->mpNodeParent == pNodeParentParent->mpNodeLeft) 
            {
                rbtree_node_base* const pNodeTemp = pNodeParentParent->mpNodeRight;

                if(pNodeTemp && (pNodeTemp->mColor == kRBTreeColorRed)) 
                {
                    pNode->mpNodeParent->mColor = kRBTreeColorBlack;
                    pNodeTemp->mColor = kRBTreeColorBlack;
                    pNodeParentParent->mColor = kRBTreeColorRed;
                    pNode = pNodeParentParent;
                }
                else 
                {
                    if(pNode == pNode->mpNodeParent->mpNodeRight) 
                    {
                        pNode = pNode->mpNodeParent;
                        pNodeRootRef = RBTreeRotateLeft(pNode, pNodeRootRef);
                    }

                    pNode->mpNodeParent->mColor = kRBTreeColorBlack;
                    pNodeParentParent->mColor = kRBTreeColorRed;
                    pNodeRootRef = RBTreeRotateRight(pNodeParentParent, pNodeRootRef);
                }
            }
            else 
            {
                rbtree_node_base* const pNodeTemp = pNodeParentParent->mpNodeLeft;

                if(pNodeTemp && (pNodeTemp->mColor == kRBTreeColorRed)) 
                {
                    pNode->mpNodeParent->mColor = kRBTreeColorBlack;
                    pNodeTemp->mColor = kRBTreeColorBlack;
                    pNodeParentParent->mColor = kRBTreeColorRed;
                    pNode = pNodeParentParent;
                }
                else 
                {
                    if(pNode == pNode->mpNodeParent->mpNodeLeft) 
                    {
                        pNode = pNode->mpNodeParent;
                        pNodeRootRef = RBTreeRotateRight(pNode, pNodeRootRef);
                    }

                    pNode->mpNodeParent->mColor = kRBTreeColorBlack;
                    pNodeParentParent->mColor = kRBTreeColorRed;
                    pNodeRootRef = RBTreeRotateLeft(pNodeParentParent, pNodeRootRef);
                }
            }
        }

        pNodeRootRef->mColor = kRBTreeColorBlack;

    }